

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void FinalizeAlloca(ExpressionContext *ctx,VmModule *module,VariableData *variable)

{
  SmallArray<VariableData_*,_4U> *this;
  TypeBase *pTVar1;
  FunctionData *pFVar2;
  VariableData **ppVVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *__function;
  ulong uVar7;
  FunctionData *function;
  ScopeData *pSVar8;
  
  pTVar1 = variable->type;
  pFVar2 = module->currentFunction->function;
  if (pFVar2 == (FunctionData *)0x0) {
    pSVar8 = ctx->globalScope;
    uVar4 = GetAlignmentOffset(pSVar8->dataSize,pTVar1->alignment);
    lVar5 = (ulong)uVar4 + pSVar8->dataSize;
    pSVar8->dataSize = pTVar1->size + lVar5;
  }
  else {
    pSVar8 = pFVar2->functionScope;
    uVar4 = GetAlignmentOffset(pFVar2->stackSize,pTVar1->alignment);
    lVar5 = (ulong)uVar4 + pFVar2->stackSize;
    pFVar2->stackSize = pTVar1->size + lVar5;
    if (pSVar8 == (ScopeData *)0x0) {
      __assert_fail("scope",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x3be,
                    "ScopeData *(anonymous namespace)::AllocateScopeSlot(ExpressionContext &, VmModule *, TypeBase *, unsigned int &)"
                   );
    }
  }
  variable->offset = (uint)lVar5;
  this = &pSVar8->allVariables;
  uVar6 = (ulong)(pSVar8->allVariables).count;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      if (this->data[uVar7] == variable) {
        return;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (variable->isVmAlloca == false) {
    __assert_fail("variable->isVmAlloca",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x9cb,"void FinalizeAlloca(ExpressionContext &, VmModule *, VariableData *)");
  }
  uVar4 = (pSVar8->variables).count;
  if (uVar4 == (pSVar8->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar8->variables,uVar4);
  }
  ppVVar3 = (pSVar8->variables).data;
  if (ppVVar3 != (VariableData **)0x0) {
    uVar4 = (pSVar8->variables).count;
    (pSVar8->variables).count = uVar4 + 1;
    ppVVar3[uVar4] = variable;
    uVar4 = (pSVar8->allVariables).count;
    if (uVar4 == (pSVar8->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(this,uVar4);
    }
    if (this->data != (VariableData **)0x0) {
      uVar4 = (pSVar8->allVariables).count;
      (pSVar8->allVariables).count = uVar4 + 1;
      this->data[uVar4] = variable;
      uVar4 = (ctx->variables).count;
      if (uVar4 == (ctx->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&ctx->variables,uVar4);
      }
      ppVVar3 = (ctx->variables).data;
      if (ppVVar3 != (VariableData **)0x0) {
        uVar4 = (ctx->variables).count;
        (ctx->variables).count = uVar4 + 1;
        ppVVar3[uVar4] = variable;
        return;
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_00192791;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_00192791:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

void FinalizeAlloca(ExpressionContext &ctx, VmModule *module, VariableData *variable)
{
	unsigned offset = 0;
	ScopeData *scope = AllocateScopeSlot(ctx, module, variable->type, offset);

	variable->offset = offset;

	bool found = false;

	for(unsigned i = 0, e = scope->allVariables.size(); i < e; i++)
	{
		if(scope->allVariables.data[i] == variable)
		{
			found = true;
			break;
		}
	}

	if(!found)
	{
		assert(variable->isVmAlloca);

		scope->variables.push_back(variable);
		scope->allVariables.push_back(variable);
		ctx.variables.push_back(variable);
	}
}